

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O3

void __thiscall
spvtools::opt::analysis::TypeManager::RegisterType(TypeManager *this,uint32_t id,Type *type)

{
  mapped_type mVar1;
  int iVar2;
  Type *pTVar3;
  mapped_type *ppTVar4;
  const_iterator cVar5;
  mapped_type *pmVar6;
  Type *rebuilt;
  mapped_type local_64;
  Type *local_60;
  _Rb_tree<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>,_std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>,_std::_Identity<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_std::less<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_std::allocator<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>_>
  local_58;
  
  local_64 = id;
  pTVar3 = RebuildType(this,id,type);
  local_58._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)((long)&local_58 + 8);
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60 = pTVar3;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar2 = (*pTVar3->_vptr_Type[2])(pTVar3,type,&local_58);
  std::
  _Rb_tree<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>,_std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>,_std::_Identity<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_std::less<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_std::allocator<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>_>
  ::_M_erase(&local_58,(_Link_type)local_58._M_impl.super__Rb_tree_header._M_header._M_parent);
  if ((char)iVar2 != '\0') {
    ppTVar4 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->id_to_type_,&local_64);
    *ppTVar4 = pTVar3;
    local_58._M_impl._0_8_ = pTVar3;
    cVar5 = std::
            _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->type_to_id_)._M_h,(key_type *)&local_58);
    mVar1 = local_64;
    if ((cVar5.
         super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
         ._M_cur == (__node_type *)0x0) ||
       (*(int *)((long)cVar5.
                       super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                       ._M_cur + 0x10) == 0)) {
      pmVar6 = std::__detail::
               _Map_base<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->type_to_id_,&local_60);
      *pmVar6 = mVar1;
    }
    return;
  }
  __assert_fail("rebuilt->IsSame(&type)",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                ,0x2fb,
                "void spvtools::opt::analysis::TypeManager::RegisterType(uint32_t, const Type &)");
}

Assistant:

void TypeManager::RegisterType(uint32_t id, const Type& type) {
  // Rebuild |type| so it and all its constituent types are owned by the type
  // pool.
  Type* rebuilt = RebuildType(id, type);
  assert(rebuilt->IsSame(&type));
  id_to_type_[id] = rebuilt;
  if (GetId(rebuilt) == 0) {
    type_to_id_[rebuilt] = id;
  }
}